

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

QWizardPage * __thiscall
QMap<int,_QWizardPage_*>::value(QMap<int,_QWizardPage_*> *this,int *key,QWizardPage **defaultValue)

{
  int iVar1;
  QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
  *pQVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  pQVar2 = (this->d).d.ptr;
  if ((pQVar2 != (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                  *)0x0) &&
     (p_Var4 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8),
     p_Var4 != (_Base_ptr)0x0)) {
    p_Var3 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header;
    iVar1 = *key;
    p_Var5 = &p_Var3->_M_header;
    do {
      if (iVar1 <= (int)p_Var4[1]._M_color) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar1];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var3) && ((int)p_Var5[1]._M_color <= iVar1)) {
      defaultValue = (QWizardPage **)&p_Var5[1]._M_parent;
    }
  }
  return (QWizardPage *)(_Base_ptr)*defaultValue;
}

Assistant:

constexpr P get() const noexcept { return ptr; }